

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmAbc.c
# Opt level: O1

void Mig_ManCreateChoices(Mig_Man_t *pMig,Gia_Man_t *p)

{
  uint uVar1;
  void *pvVar2;
  long lVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pGVar6;
  int *piVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  
  uVar10 = p->nObjs;
  if (pMig->nObjs != uVar10) {
    __assert_fail("Mig_ManObjNum(pMig) == Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmAbc.c"
                  ,0x32,"void Mig_ManCreateChoices(Mig_Man_t *, Gia_Man_t *)");
  }
  if ((pMig->vSibls).nSize != 0) {
    __assert_fail("Vec_IntSize(&pMig->vSibls) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmAbc.c"
                  ,0x33,"void Mig_ManCreateChoices(Mig_Man_t *, Gia_Man_t *)");
  }
  if ((pMig->vSibls).nCap < (int)uVar10) {
    piVar7 = (pMig->vSibls).pArray;
    if (piVar7 == (int *)0x0) {
      piVar7 = (int *)malloc((long)(int)uVar10 << 2);
    }
    else {
      piVar7 = (int *)realloc(piVar7,(long)(int)uVar10 << 2);
    }
    (pMig->vSibls).pArray = piVar7;
    if (piVar7 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (pMig->vSibls).nCap = uVar10;
  }
  if (0 < (int)uVar10) {
    memset((pMig->vSibls).pArray,0,(ulong)uVar10 * 4);
  }
  (pMig->vSibls).nSize = uVar10;
  Gia_ManMarkFanoutDrivers(p);
  if (p->nObjs < 1) {
LAB_008b3da0:
    Gia_ManCleanMark0(p);
    return;
  }
  uVar11 = 0;
LAB_008b3bbe:
  if (p->pObjs != (Gia_Obj_t *)0x0) {
    pGVar5 = p->pObjs + uVar11;
    Gia_ObjSetPhase(p,pGVar5);
    if ((int)pGVar5->Value < 0) {
LAB_008b3db3:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12f,"int Abc_Lit2Var(int)");
    }
    if (uVar11 != pGVar5->Value >> 1) {
      __assert_fail("Abc_Lit2Var(pObj->Value) == i",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmAbc.c"
                    ,0x39,"void Mig_ManCreateChoices(Mig_Man_t *, Gia_Man_t *)");
    }
    if ((long)pMig->nObjs <= (long)uVar11) {
LAB_008b3e2f:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMig.h"
                    ,0x74,"Mig_Obj_t *Mig_ManObj(Mig_Man_t *, int)");
    }
    uVar8 = uVar11 >> 0xc & 0xfffff;
    if ((pMig->vPages).nSize <= (int)uVar8) {
LAB_008b3e10:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    pvVar2 = (pMig->vPages).pArray[uVar8];
    uVar8 = (ulong)(((uint)uVar11 & 0xfff) << 4);
    *(uint *)((long)pvVar2 + uVar8 + 0xc) =
         *(uint *)((long)pvVar2 + uVar8 + 0xc) & 0xfffffffe |
         (uint)((ulong)*(undefined8 *)pGVar5 >> 0x3f);
    piVar7 = p->pSibls;
    if (((piVar7 != (int *)0x0) && (piVar7[uVar11] != 0)) && ((pGVar5->field_0x3 & 0x40) != 0)) {
      if (piVar7 != (int *)0x0) {
        uVar10 = piVar7[uVar11];
        if ((ulong)uVar10 != 0) {
          if (((int)uVar10 < 0) || (p->nObjs <= (int)uVar10)) {
LAB_008b3e6d:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          pGVar6 = p->pObjs + uVar10;
          goto joined_r0x008b3c94;
        }
      }
      pGVar6 = (Gia_Obj_t *)0x0;
joined_r0x008b3c94:
      do {
        if (pGVar6 == (Gia_Obj_t *)0x0) goto LAB_008b3d8c;
        uVar10 = pGVar5->Value;
        if ((int)uVar10 < 0) goto LAB_008b3db3;
        if (pMig->nObjs <= (int)(uVar10 >> 1)) goto LAB_008b3e2f;
        if ((pMig->vPages).nSize <= (int)(uVar10 >> 0xd)) goto LAB_008b3e10;
        uVar1 = pGVar6->Value;
        if ((int)uVar1 < 0) goto LAB_008b3db3;
        if (uVar1 < 2) {
LAB_008b3dd2:
          __assert_fail("s > 0 && Mig_ObjId(p) > s",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMig.h"
                        ,0xbd,"void Mig_ObjSetSiblId(Mig_Obj_t *, int)");
        }
        uVar9 = (uVar10 >> 1 & 0xfff) << 4;
        pvVar2 = (pMig->vPages).pArray[uVar10 >> 0xd];
        uVar10 = *(uint *)((long)pvVar2 + (ulong)uVar9 + 0xc) >> 1;
        if (uVar10 <= uVar1 >> 1) goto LAB_008b3dd2;
        lVar3 = *(long *)((long)pvVar2 + ((ulong)uVar9 - (ulong)((uVar10 & 0xfff) << 4)) + -0x10);
        if (*(int *)(lVar3 + 0x7c) <= (int)uVar10) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        *(uint *)(*(long *)(lVar3 + 0x80) + (ulong)uVar10 * 4) = uVar1 >> 1;
        pGVar4 = p->pObjs;
        if ((pGVar6 < pGVar4) || (pGVar4 + p->nObjs <= pGVar6)) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        pGVar5 = pGVar6;
        if (piVar7 != (int *)0x0) {
          uVar10 = piVar7[(int)((ulong)((long)pGVar6 - (long)pGVar4) >> 2) * -0x55555555];
          if ((ulong)uVar10 != 0) {
            if (((int)uVar10 < 0) || (p->nObjs <= (int)uVar10)) goto LAB_008b3e6d;
            pGVar6 = pGVar4 + uVar10;
            goto joined_r0x008b3c94;
          }
        }
        pGVar6 = (Gia_Obj_t *)0x0;
      } while( true );
    }
    goto LAB_008b3d90;
  }
  goto LAB_008b3da0;
LAB_008b3d8c:
  pMig->nChoices = pMig->nChoices + 1;
LAB_008b3d90:
  uVar11 = uVar11 + 1;
  if ((long)p->nObjs <= (long)uVar11) goto LAB_008b3da0;
  goto LAB_008b3bbe;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Mig_ManCreateChoices( Mig_Man_t * pMig, Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    assert( Mig_ManObjNum(pMig) == Gia_ManObjNum(p) );
    assert( Vec_IntSize(&pMig->vSibls) == 0 );
    Vec_IntFill( &pMig->vSibls, Gia_ManObjNum(p), 0 );
    Gia_ManMarkFanoutDrivers( p );
    Gia_ManForEachObj( p, pObj, i )
    {
        Gia_ObjSetPhase( p, pObj );
        assert( Abc_Lit2Var(pObj->Value) == i );
        Mig_ObjSetPhase( Mig_ManObj(pMig, i), pObj->fPhase );
        if ( Gia_ObjSibl(p, i) && pObj->fMark0 )
        {
            Gia_Obj_t * pSibl, * pPrev;
            for ( pPrev = pObj, pSibl = Gia_ObjSiblObj(p, i); pSibl; pPrev = pSibl, pSibl = Gia_ObjSiblObj(p, Gia_ObjId(p, pSibl)) )
                Mig_ObjSetSiblId( Mig_ManObj(pMig, Abc_Lit2Var(pPrev->Value)), Abc_Lit2Var(pSibl->Value) );
            pMig->nChoices++;
        }
    }
    Gia_ManCleanMark0( p );
}